

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O3

int ask_user_int(char *szPrompt,int iDefault)

{
  long lVar1;
  char enter [30];
  char local_38 [40];
  
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0x18] = '\0';
  local_38[0x19] = '\0';
  local_38[0x1a] = '\0';
  local_38[0x1b] = '\0';
  local_38[0x1c] = '\0';
  local_38[0x1d] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  printf("%s <%d>: ",szPrompt,iDefault);
  fgets(local_38,0x1d,_stdin);
  if ((local_38[0] != '\0') && (local_38[0] != '\n')) {
    lVar1 = strtol(local_38,(char **)0x0,10);
    iDefault = (int)lVar1;
  }
  return iDefault;
}

Assistant:

int
ask_user_int (const char* szPrompt, int iDefault)
{
    char    enter[30] = "";
    printf("%s <%d>: ", szPrompt, iDefault);
    fgets(enter, sizeof(enter)-1, stdin);
    if('\0' == enter[0] || '\n' == enter[0])
        return iDefault;
    return strtol(enter, NULL, 10);
}